

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O0

btScalar __thiscall
btJacobianEntry::getRelativeVelocity
          (btJacobianEntry *this,btVector3 *linvelA,btVector3 *angvelA,btVector3 *linvelB,
          btVector3 *angvelB)

{
  btScalar *pbVar1;
  btVector3 *in_RDI;
  float fVar2;
  btScalar rel_vel2;
  btVector3 angvelb;
  btVector3 angvela;
  btVector3 linrel;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  btScalar bVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  btVector3 local_58;
  btVector3 local_48;
  btVector3 local_38 [3];
  
  local_38[0] = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                          ,(btVector3 *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_48 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  local_58 = ::operator*((btVector3 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (btVector3 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
  ;
  btVector3::operator*=(local_38,in_RDI);
  btVector3::operator+=(&local_48,&local_58);
  btVector3::operator+=(&local_48,local_38);
  pbVar1 = btVector3::operator_cast_to_float_(&local_48);
  bVar3 = *pbVar1;
  pbVar1 = btVector3::operator_cast_to_float_(&local_48);
  fVar2 = bVar3 + pbVar1[1];
  pbVar1 = btVector3::operator_cast_to_float_(&local_48);
  return fVar2 + pbVar1[2] + 1.1920929e-07;
}

Assistant:

btScalar getRelativeVelocity(const btVector3& linvelA,const btVector3& angvelA,const btVector3& linvelB,const btVector3& angvelB)
	{
		btVector3 linrel = linvelA - linvelB;
		btVector3 angvela  = angvelA * m_aJ;
		btVector3 angvelb  = angvelB * m_bJ;
		linrel *= m_linearJointAxis;
		angvela += angvelb;
		angvela += linrel;
		btScalar rel_vel2 = angvela[0]+angvela[1]+angvela[2];
		return rel_vel2 + SIMD_EPSILON;
	}